

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O1

void __thiscall
miniros::TransportTCP::setKeepAlive
          (TransportTCP *this,bool use,uint32_t idle,uint32_t interval,uint32_t count)

{
  socket_fd_t *psVar1;
  int iVar2;
  undefined7 in_register_00000031;
  int val;
  uint32_t local_54;
  string local_50;
  
  psVar1 = &this->sock_;
  if ((int)CONCAT71(in_register_00000031,use) == 0) {
    local_54 = 0;
    iVar2 = setsockopt(*psVar1,1,9,&local_54,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.transport_tcp","");
        console::initializeLogLocation
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        setKeepAlive();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ == true) {
        setKeepAlive();
      }
    }
  }
  else {
    local_54 = 1;
    iVar2 = setsockopt(*psVar1,1,9,&local_54,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.transport_tcp","");
        console::initializeLogLocation(&setKeepAlive::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (setKeepAlive::loc.level_ != Debug) {
        setKeepAlive();
      }
      if (setKeepAlive::loc.logger_enabled_ == true) {
        setKeepAlive();
      }
    }
    local_54 = idle;
    iVar2 = setsockopt(*psVar1,6,4,&local_54,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.transport_tcp","");
        console::initializeLogLocation
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        setKeepAlive();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ == true) {
        setKeepAlive();
      }
    }
    local_54 = interval;
    iVar2 = setsockopt(*psVar1,6,5,&local_54,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.transport_tcp","");
        console::initializeLogLocation
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        setKeepAlive();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ == true) {
        setKeepAlive();
      }
    }
    local_54 = count;
    iVar2 = setsockopt(*psVar1,6,6,&local_54,4);
    if (iVar2 != 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.initialized_ == false) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"miniros.transport_tcp","");
        console::initializeLogLocation
                  (&setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc,&local_50,Debug);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.level_ != Debug) {
        setKeepAlive();
      }
      if (setKeepAlive(bool,unsigned_int,unsigned_int,unsigned_int)::loc.logger_enabled_ == true) {
        setKeepAlive();
      }
    }
  }
  return;
}

Assistant:

void TransportTCP::setKeepAlive(bool use, uint32_t idle, uint32_t interval, uint32_t count)
{
  if (use)
  {
    int val = 1;
    if (setsockopt(sock_, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<const char*>(&val), sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }

/* cygwin SOL_TCP does not seem to support TCP_KEEPIDLE, TCP_KEEPINTVL, TCP_KEEPCNT */
#if defined(SOL_TCP) && defined(TCP_KEEPIDLE)
    val = idle;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPIDLE, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPIDLE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)idle;
#endif

#if defined(SOL_TCP) && defined(TCP_KEEPINTVL)
    val = interval;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPINTVL, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPINTVL on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)interval;
#endif

#if defined(SOL_TCP) && defined(TCP_KEEPCNT)
    val = count;
    if (setsockopt(sock_, SOL_TCP, TCP_KEEPCNT, &val, sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set TCP_KEEPCNT on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
#else
    (void)count;
#endif
  }
  else
  {
    int val = 0;
    if (setsockopt(sock_, SOL_SOCKET, SO_KEEPALIVE, reinterpret_cast<const char*>(&val), sizeof(val)) != 0)
    {
      MINIROS_DEBUG("setsockopt failed to set SO_KEEPALIVE on socket [%d] [%s]", sock_, cached_remote_host_.c_str());
    }
  }
}